

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_equal(lua_State *L,GCobj *o1,GCobj *o2,int ne)

{
  int iVar1;
  cTValue *o1_00;
  cTValue *o2_00;
  ulong uVar2;
  TValue *pTVar3;
  code *pcVar4;
  
  pTVar3 = (o1->th).base;
  if ((pTVar3 == (TValue *)0x0) || ((*(uint8_t *)((long)pTVar3 + 10) & 0x10) != 0))
  goto LAB_00118b4a;
  o1_00 = lj_tab_getstr((GCtab *)&pTVar3->gcr,*(GCstr **)((L->glref).ptr64 + 0x1c8));
  if ((o1_00 != (cTValue *)0x0) && (o1_00->u64 != 0xffffffffffffffff)) {
    pTVar3 = (o2->th).base;
    if ((o1->th).base == pTVar3) {
LAB_00118ae9:
      uVar2 = L->base[-2].u64 & 0x7fffffffffff;
      if (*(char *)(uVar2 + 10) == '\0') {
        pTVar3 = L->base + *(byte *)(*(long *)(uVar2 + 0x20) + -0x5d);
      }
      else {
        pTVar3 = L->top;
      }
      pcVar4 = lj_cont_condf;
      if (ne == 0) {
        pcVar4 = lj_cont_condt;
      }
      pTVar3->n = (lua_Number)pcVar4;
      pTVar3[1].u64 = 0xffffffffffffffff;
      pTVar3[2] = *o1_00;
      pTVar3[3].u64 = 0xffffffffffffffff;
      uVar2 = (ulong)~(uint)(o1->gch).gct << 0x2f;
      pTVar3[4].u64 = (ulong)o1 | uVar2;
      pTVar3[5].u64 = uVar2 | (ulong)o2;
      return pTVar3 + 4;
    }
    if ((pTVar3 == (TValue *)0x0) || ((*(uint8_t *)((long)pTVar3 + 10) & 0x10) != 0))
    goto LAB_00118b4a;
    o2_00 = lj_tab_getstr((GCtab *)&pTVar3->gcr,*(GCstr **)((L->glref).ptr64 + 0x1c8));
    if ((o2_00 != (cTValue *)0x0) && (o2_00->u64 != 0xffffffffffffffff)) {
      iVar1 = lj_obj_equal(o1_00,o2_00);
      if (iVar1 != 0) goto LAB_00118ae9;
      goto LAB_00118b4a;
    }
  }
  *(uint8_t *)((long)pTVar3 + 10) = *(uint8_t *)((long)pTVar3 + 10) | 0x10;
LAB_00118b4a:
  return (TValue *)(long)ne;
}

Assistant:

TValue *lj_meta_equal(lua_State *L, GCobj *o1, GCobj *o2, int ne)
{
  /* Field metatable must be at same offset for GCtab and GCudata! */
  cTValue *mo = lj_meta_fast(L, tabref(o1->gch.metatable), MM_eq);
  if (mo) {
    TValue *top;
    uint32_t it;
    if (tabref(o1->gch.metatable) != tabref(o2->gch.metatable)) {
      cTValue *mo2 = lj_meta_fast(L, tabref(o2->gch.metatable), MM_eq);
      if (mo2 == NULL || !lj_obj_equal(mo, mo2))
	return (TValue *)(intptr_t)ne;
    }
    top = curr_top(L);
    setcont(top++, ne ? lj_cont_condf : lj_cont_condt);
    if (LJ_FR2) setnilV(top++);
    copyTV(L, top++, mo);
    if (LJ_FR2) setnilV(top++);
    it = ~(uint32_t)o1->gch.gct;
    setgcV(L, top, o1, it);
    setgcV(L, top+1, o2, it);
    return top;  /* Trigger metamethod call. */
  }
  return (TValue *)(intptr_t)ne;
}